

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp,stbi__result_info *ri)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint *puVar6;
  stbi_uc sVar7;
  byte bVar8;
  uint x;
  uint y;
  char *pcVar9;
  undefined8 *puVar10;
  byte *pbVar11;
  stbi_uc *psVar12;
  ulong uVar13;
  uchar *puVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int left_1;
  uint req_comp_00;
  stbi_uc *psVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  int *piVar22;
  stbi_uc sVar23;
  uint uVar24;
  int left;
  stbi_uc value [4];
  stbi__pic_packet packets [10];
  uchar *local_d0;
  uint local_c4;
  stbi_uc local_ac [4];
  undefined8 *local_a8;
  uint local_9c;
  ulong local_98;
  stbi_uc *local_90;
  int local_88;
  int local_84;
  uint *local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  uint *local_60;
  stbi_uc local_58 [2];
  byte local_56 [38];
  
  iVar16 = 0x5c;
  local_9c = req_comp;
  do {
    psVar18 = s->img_buffer;
    if (psVar18 < s->img_buffer_end) {
LAB_0012f2a7:
      s->img_buffer = psVar18 + 1;
    }
    else if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar18 = s->img_buffer;
      goto LAB_0012f2a7;
    }
    iVar16 = iVar16 + -1;
  } while (iVar16 != 0);
  x = stbi__get16be(s);
  y = stbi__get16be(s);
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0012f2ea:
    if (s->img_buffer_end <= s->img_buffer) {
LAB_0012f546:
      puVar10 = (undefined8 *)__tls_get_addr(&PTR_00164d50);
      pcVar9 = "bad file";
      goto LAB_0012f598;
    }
  }
  else {
    iVar16 = (*(s->io).eof)(s->io_user_data);
    if (iVar16 != 0) {
      if (s->read_from_callbacks != 0) goto LAB_0012f2ea;
      goto LAB_0012f546;
    }
  }
  if ((y == 0) || ((x <= (uint)(0x7fffffff / (ulong)y) && (y * x < 0x20000000)))) {
    local_60 = (uint *)px;
    stbi__get16be(s);
    stbi__get16be(s);
    stbi__get16be(s);
    stbi__get16be(s);
    uVar24 = 0;
    local_d0 = (uchar *)stbi__malloc_mad3(x,y,4,0);
    if (local_d0 != (uchar *)0x0) {
      local_80 = (uint *)py;
      memset(local_d0,0xff,(ulong)(y * x * 4));
      local_a8 = (undefined8 *)__tls_get_addr(&PTR_00164d50);
      req_comp_00 = 0;
      piVar22 = comp;
      do {
        if (uVar24 == 10) {
          pcVar9 = "bad format";
LAB_0012f505:
          *local_a8 = pcVar9;
          bVar3 = false;
        }
        else {
          pbVar11 = s->img_buffer;
          if (pbVar11 < s->img_buffer_end) {
LAB_0012f3eb:
            s->img_buffer = pbVar11 + 1;
            piVar22 = (int *)(ulong)*pbVar11;
          }
          else {
            if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              pbVar11 = s->img_buffer;
              goto LAB_0012f3eb;
            }
            piVar22 = (int *)0x0;
          }
          psVar18 = s->img_buffer;
          if (psVar18 < s->img_buffer_end) {
LAB_0012f424:
            s->img_buffer = psVar18 + 1;
            sVar23 = *psVar18;
          }
          else {
            if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              psVar18 = s->img_buffer;
              goto LAB_0012f424;
            }
            sVar23 = '\0';
          }
          lVar2 = (long)(int)uVar24 * 3;
          local_58[lVar2] = sVar23;
          psVar18 = s->img_buffer;
          if (psVar18 < s->img_buffer_end) {
LAB_0012f471:
            s->img_buffer = psVar18 + 1;
            sVar7 = *psVar18;
          }
          else {
            if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              psVar18 = s->img_buffer;
              goto LAB_0012f471;
            }
            sVar7 = '\0';
          }
          local_58[lVar2 + 1] = sVar7;
          pbVar11 = s->img_buffer;
          if (pbVar11 < s->img_buffer_end) {
LAB_0012f4ab:
            s->img_buffer = pbVar11 + 1;
            bVar8 = *pbVar11;
          }
          else {
            if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              pbVar11 = s->img_buffer;
              goto LAB_0012f4ab;
            }
            bVar8 = 0;
          }
          uVar24 = uVar24 + 1;
          local_58[lVar2 + 2] = bVar8;
          req_comp_00 = req_comp_00 | bVar8;
          if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0012f4dd:
            if (s->img_buffer_end <= s->img_buffer) {
LAB_0012f4fe:
              pcVar9 = "bad file";
              goto LAB_0012f505;
            }
          }
          else {
            iVar16 = (*(s->io).eof)(s->io_user_data);
            if (iVar16 != 0) {
              if (s->read_from_callbacks != 0) goto LAB_0012f4dd;
              goto LAB_0012f4fe;
            }
          }
          bVar3 = true;
          pcVar9 = "bad format";
          if (sVar23 != '\b') goto LAB_0012f505;
        }
        bVar4 = true;
        bVar5 = true;
        if (!bVar3) goto LAB_0012f96f;
      } while ((int)piVar22 != 0);
      req_comp_00 = 4 - ((req_comp_00 & 0x10) == 0);
      if (comp != (int *)0x0) {
        *comp = req_comp_00;
      }
      if (y != 0) {
        local_88 = x * 4;
        local_78 = (ulong)y;
        local_70 = (ulong)uVar24;
        local_98 = 0;
        do {
          if (0 < (int)uVar24) {
            local_90 = local_d0 + local_88 * (int)local_98;
            uVar13 = 0;
            do {
              lVar2 = uVar13 * 3;
              sVar23 = local_58[lVar2 + 1];
              local_68 = uVar13;
              bVar4 = bVar5;
              if (sVar23 == '\0') {
                if (x != 0) {
                  bVar8 = local_58[lVar2 + 2];
                  psVar18 = local_90;
                  uVar19 = x;
                  do {
                    psVar12 = stbi__readval(s,(uint)bVar8,psVar18);
                    if (psVar12 == (stbi_uc *)0x0) goto LAB_0012f96f;
                    psVar18 = psVar18 + 4;
                    uVar19 = uVar19 - 1;
                  } while (uVar19 != 0);
                }
              }
              else {
                psVar18 = local_90;
                uVar19 = x;
                if (sVar23 == '\x01') {
                  while (0 < (int)uVar19) {
                    pbVar11 = s->img_buffer;
                    if (pbVar11 < s->img_buffer_end) {
LAB_0012f80a:
                      s->img_buffer = pbVar11 + 1;
                      bVar8 = *pbVar11;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        pbVar11 = s->img_buffer;
                        goto LAB_0012f80a;
                      }
                      bVar8 = 0;
                    }
                    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0012f832:
                      if (s->img_buffer < s->img_buffer_end) goto LAB_0012f842;
LAB_0012f8a2:
                      *local_a8 = "bad file";
LAB_0012f8b1:
                      bVar3 = false;
                    }
                    else {
                      iVar16 = (*(s->io).eof)(s->io_user_data);
                      if (iVar16 != 0) {
                        if (s->read_from_callbacks != 0) goto LAB_0012f832;
                        goto LAB_0012f8a2;
                      }
LAB_0012f842:
                      psVar12 = stbi__readval(s,(uint)local_58[lVar2 + 2],local_ac);
                      if (psVar12 == (stbi_uc *)0x0) goto LAB_0012f8b1;
                      if ((int)uVar19 < (int)(uint)bVar8) {
                        bVar8 = (byte)uVar19;
                      }
                      if (bVar8 != 0) {
                        uVar15 = 0;
                        do {
                          bVar1 = local_58[lVar2 + 2];
                          uVar20 = 0x80;
                          lVar21 = 0;
                          do {
                            if ((uVar20 & bVar1) != 0) {
                              psVar18[lVar21] = local_ac[lVar21];
                            }
                            lVar21 = lVar21 + 1;
                            uVar20 = uVar20 >> 1;
                          } while (lVar21 != 4);
                          uVar15 = uVar15 + 1;
                          psVar18 = psVar18 + 4;
                        } while (uVar15 != bVar8);
                      }
                      uVar19 = uVar19 - bVar8;
                      bVar3 = true;
                    }
                    if (!bVar3) goto LAB_0012f96f;
                  }
                }
                else {
                  local_c4 = x;
                  if (sVar23 != '\x02') {
                    *local_a8 = "bad format";
                    goto LAB_0012f96f;
                  }
                  while (0 < (int)local_c4) {
                    pbVar11 = s->img_buffer;
                    if (pbVar11 < s->img_buffer_end) {
LAB_0012f6b2:
                      s->img_buffer = pbVar11 + 1;
                      bVar8 = *pbVar11;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        pbVar11 = s->img_buffer;
                        goto LAB_0012f6b2;
                      }
                      bVar8 = 0;
                    }
                    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0012f6d9:
                      if (s->img_buffer_end <= s->img_buffer) goto LAB_0012f726;
LAB_0012f6e9:
                      uVar19 = (uint)bVar8;
                      if ((char)bVar8 < '\0') {
                        if (uVar19 == 0x80) {
                          iVar16 = stbi__get16be(s);
                        }
                        else {
                          iVar16 = uVar19 - 0x7f;
                        }
                        if ((int)local_c4 < iVar16) {
                          *local_a8 = "bad file";
LAB_0012f7cb:
                          bVar3 = false;
                        }
                        else {
                          psVar12 = stbi__readval(s,(uint)local_58[lVar2 + 2],local_ac);
                          if (psVar12 == (stbi_uc *)0x0) goto LAB_0012f7cb;
                          bVar3 = true;
                          if (0 < iVar16) {
                            iVar17 = 0;
                            do {
                              bVar8 = local_58[lVar2 + 2];
                              uVar19 = 0x80;
                              lVar21 = 0;
                              do {
                                if ((uVar19 & bVar8) != 0) {
                                  psVar18[lVar21] = local_ac[lVar21];
                                }
                                lVar21 = lVar21 + 1;
                                uVar19 = uVar19 >> 1;
                              } while (lVar21 != 4);
                              iVar17 = iVar17 + 1;
                              psVar18 = psVar18 + 4;
                            } while (iVar17 != iVar16);
                          }
                        }
                        if (bVar3) goto LAB_0012f7d5;
                        goto LAB_0012f735;
                      }
                      if ((int)local_c4 <= (int)uVar19) goto LAB_0012f726;
                      local_84 = uVar19 + 1;
                      iVar17 = uVar19 + 1;
                      do {
                        psVar12 = stbi__readval(s,(uint)local_58[lVar2 + 2],psVar18);
                        if (psVar12 == (stbi_uc *)0x0) goto LAB_0012f735;
                        psVar18 = psVar18 + 4;
                        iVar17 = iVar17 + -1;
                        iVar16 = local_84;
                      } while (iVar17 != 0);
LAB_0012f7d5:
                      local_c4 = local_c4 - iVar16;
                      bVar3 = true;
                    }
                    else {
                      iVar16 = (*(s->io).eof)(s->io_user_data);
                      if (iVar16 == 0) goto LAB_0012f6e9;
                      if (s->read_from_callbacks != 0) goto LAB_0012f6d9;
LAB_0012f726:
                      *local_a8 = "bad file";
LAB_0012f735:
                      bVar3 = false;
                    }
                    if (!bVar3) goto LAB_0012f96f;
                  }
                }
              }
              uVar13 = local_68 + 1;
            } while (uVar13 != local_70);
          }
          local_98 = local_98 + 1;
        } while (local_98 != local_78);
      }
      bVar4 = false;
LAB_0012f96f:
      puVar6 = local_60;
      if (bVar4) {
        free(local_d0);
        local_d0 = (uchar *)0x0;
      }
      *puVar6 = x;
      *local_80 = y;
      if (local_9c != 0) {
        req_comp_00 = local_9c;
      }
      if (local_9c == 0 && comp != (int *)0x0) {
        req_comp_00 = *comp;
      }
      puVar14 = stbi__convert_format(local_d0,4,req_comp_00,x,y);
      return puVar14;
    }
    puVar10 = (undefined8 *)__tls_get_addr(&PTR_00164d50);
    pcVar9 = "outofmem";
  }
  else {
    puVar10 = (undefined8 *)__tls_get_addr(&PTR_00164d50);
    pcVar9 = "too large";
  }
LAB_0012f598:
  *puVar10 = pcVar9;
  return (void *)0x0;
}

Assistant:

static void *stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp, stbi__result_info *ri)
{
   stbi_uc *result;
   int i, x,y, internal_comp;
   STBI_NOTUSED(ri);

   if (!comp) comp = &internal_comp;

   for (i=0; i<92; ++i)
      stbi__get8(s);

   x = stbi__get16be(s);
   y = stbi__get16be(s);

   if (y > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (x > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   if (stbi__at_eof(s))  return stbi__errpuc("bad file","file too short (pic header)");
   if (!stbi__mad3sizes_valid(x, y, 4, 0)) return stbi__errpuc("too large", "PIC image too large to decode");

   stbi__get32be(s); //skip `ratio'
   stbi__get16be(s); //skip `fields'
   stbi__get16be(s); //skip `pad'

   // intermediate buffer is RGBA
   result = (stbi_uc *) stbi__malloc_mad3(x, y, 4, 0);
   if (!result) return stbi__errpuc("outofmem", "Out of memory");
   memset(result, 0xff, x*y*4);

   if (!stbi__pic_load_core(s,x,y,comp, result)) {
      STBI_FREE(result);
      result=0;
   }
   *px = x;
   *py = y;
   if (req_comp == 0) req_comp = *comp;
   result=stbi__convert_format(result,4,req_comp,x,y);

   return result;
}